

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O2

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer>::Parenthesizer::~Parenthesizer
          (Parenthesizer *this)

{
  ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *pEVar1;
  
  pEVar1 = this->writer_;
  pEVar1->precedence_ = this->saved_precedence_;
  if (this->write_paren_ == true) {
    fmt::BasicWriter<char>::operator<<(pEVar1->writer_,')');
  }
  return;
}

Assistant:

ExprWriter<ExprTypes, VarNamer>::Parenthesizer::~Parenthesizer() {
  writer_.precedence_ = saved_precedence_;
  if (write_paren_)
    writer_.writer_ << ')';
}